

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcMem.c
# Opt level: O2

void Wlc_NtkMemBlast_rec(Wlc_Ntk_t *pNew,Wlc_Ntk_t *p,int iObj,Vec_Int_t *vFanins)

{
  Vec_Int_t *p_00;
  byte bVar1;
  uint __line;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Wlc_Obj_t *pWVar6;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  Wlc_Obj_t *pWVar7;
  Wlc_Obj_t *pWVar8;
  Wlc_Obj_t *pWVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  char *__assertion;
  bool bVar13;
  
  p_00 = &p->vCopies;
  iVar2 = Vec_IntEntry(p_00,iObj);
  if (iVar2 != 0) {
    return;
  }
  pWVar6 = Wlc_NtkObj(p,iObj);
  for (iVar2 = 0; iVar2 < (int)pWVar6->nFanins; iVar2 = iVar2 + 1) {
    iVar3 = Wlc_ObjFaninId(pWVar6,iVar2);
    Wlc_NtkMemBlast_rec(pNew,p,iVar3,vFanins);
  }
  if ((*(ushort *)pWVar6 & 0x3f) == 0x36) {
    p_02 = Vec_IntAlloc(1);
    pWVar7 = Wlc_ObjFanin0(p,pWVar6);
    pWVar8 = Wlc_ObjFanin1(p,pWVar6);
    iVar3 = pWVar6->End - pWVar6->Beg;
    iVar2 = -iVar3;
    if (0 < iVar3) {
      iVar2 = iVar3;
    }
    iVar4 = pWVar8->End - pWVar8->Beg;
    iVar3 = -iVar4;
    if (0 < iVar4) {
      iVar3 = iVar4;
    }
    iVar10 = pWVar7->End - pWVar7->Beg;
    iVar4 = -iVar10;
    if (0 < iVar10) {
      iVar4 = iVar10;
    }
    if (iVar2 + 1 << ((byte)iVar3 + 1 & 0x1f) == iVar4 + 1) {
      bVar1 = (byte)iVar3 & 0x1f;
      vFanins->nSize = 0;
      iVar3 = Vec_IntEntry(p_00,(int)(((long)pWVar8 - (long)p->pObjs) / 0x18));
      Vec_IntPush(vFanins,iVar3);
      iVar4 = 0;
      iVar3 = 2 << bVar1;
      if (2 << bVar1 < 1) {
        iVar3 = iVar4;
      }
      while (bVar13 = iVar3 != 0, iVar3 = iVar3 + -1, bVar13) {
        iVar10 = Wlc_ObjAlloc(pNew,0x16,0,iVar2 + iVar4,iVar4);
        iVar12 = Vec_IntEntry(p_00,(int)(((long)pWVar7 - (long)p->pObjs) / 0x18));
        Vec_IntFill(p_02,1,iVar12);
        Vec_IntPushTwo(p_02,iVar2 + iVar4,iVar4);
        pWVar6 = Wlc_NtkObj(pNew,iVar10);
        Wlc_ObjAddFanins(pNew,pWVar6,p_02);
        Vec_IntPush(vFanins,iVar10);
        iVar4 = iVar4 + iVar2 + 1;
      }
      iVar2 = Wlc_ObjAlloc(pNew,8,0,iVar2,0);
      pWVar6 = Wlc_NtkObj(pNew,iVar2);
      Wlc_ObjAddFanins(pNew,pWVar6,vFanins);
      Vec_IntWriteEntry(p_00,iObj,iVar2);
LAB_002ffc10:
      Vec_IntFree(p_02);
      return;
    }
    __assertion = "nRegs * DataW == Wlc_ObjRange(pMem)";
    __line = 0x73;
  }
  else {
    if ((*(ushort *)pWVar6 & 0x3f) != 0x37) {
      Wlc_ObjDup(pNew,p,iObj,vFanins);
      return;
    }
    p_01 = Vec_IntAlloc(1);
    p_02 = Vec_IntAlloc(100);
    pWVar7 = Wlc_ObjFanin0(p,pWVar6);
    pWVar8 = Wlc_ObjFanin1(p,pWVar6);
    pWVar9 = Wlc_ObjFanin2(p,pWVar6);
    iVar3 = pWVar9->End - pWVar9->Beg;
    iVar2 = -iVar3;
    if (0 < iVar3) {
      iVar2 = iVar3;
    }
    iVar4 = pWVar8->End - pWVar8->Beg;
    iVar3 = -iVar4;
    if (0 < iVar4) {
      iVar3 = iVar4;
    }
    bVar1 = (byte)iVar3 & 0x1f;
    iVar4 = 2 << bVar1;
    iVar12 = iVar2 + 1 << ((byte)iVar3 + 1 & 0x1f);
    iVar10 = pWVar7->End - pWVar7->Beg;
    iVar3 = -iVar10;
    if (0 < iVar10) {
      iVar3 = iVar10;
    }
    if (iVar12 == iVar3 + 1) {
      iVar11 = pWVar6->End - pWVar6->Beg;
      iVar10 = -iVar11;
      if (0 < iVar11) {
        iVar10 = iVar11;
      }
      if (iVar10 == iVar3) {
        iVar11 = 0;
        iVar3 = Wlc_ObjAlloc(pNew,0x3a,0,iVar4 + -1,0);
        iVar10 = Vec_IntEntry(p_00,(int)(((long)pWVar8 - (long)p->pObjs) / 0x18));
        Vec_IntFill(p_01,1,iVar10);
        pWVar6 = Wlc_NtkObj(pNew,iVar3);
        Wlc_ObjAddFanins(pNew,pWVar6,p_01);
        if (2 << bVar1 < 1) {
          iVar4 = iVar11;
        }
        for (; iVar4 != iVar11; iVar11 = iVar11 + 1) {
          iVar10 = Wlc_ObjAlloc(pNew,0x16,0,iVar11,iVar11);
          Vec_IntFill(p_01,1,iVar3);
          Vec_IntPushTwo(p_01,iVar11,iVar11);
          pWVar6 = Wlc_NtkObj(pNew,iVar10);
          Wlc_ObjAddFanins(pNew,pWVar6,p_01);
          Vec_IntPush(p_02,iVar10);
        }
        vFanins->nSize = 0;
        iVar10 = 0;
        iVar3 = iVar4;
        while (bVar13 = iVar3 != 0, iVar3 = iVar3 + -1, bVar13) {
          iVar11 = Wlc_ObjAlloc(pNew,0x16,0,iVar2 + iVar10,iVar10);
          iVar5 = Vec_IntEntry(p_00,(int)(((long)pWVar7 - (long)p->pObjs) / 0x18));
          Vec_IntFill(p_01,1,iVar5);
          Vec_IntPushTwo(p_01,iVar2 + iVar10,iVar10);
          pWVar6 = Wlc_NtkObj(pNew,iVar11);
          Wlc_ObjAddFanins(pNew,pWVar6,p_01);
          Vec_IntPush(vFanins,iVar11);
          iVar10 = iVar10 + iVar2 + 1;
        }
        for (iVar3 = 0; iVar4 != iVar3; iVar3 = iVar3 + 1) {
          iVar10 = Wlc_ObjAlloc(pNew,8,0,iVar2,0);
          iVar11 = Vec_IntEntry(p_02,iVar3);
          Vec_IntFill(p_01,1,iVar11);
          iVar11 = Vec_IntEntry(p_00,(int)(((long)pWVar9 - (long)p->pObjs) / 0x18));
          iVar5 = Vec_IntEntry(vFanins,iVar3);
          Vec_IntPushTwo(p_01,iVar11,iVar5);
          pWVar6 = Wlc_NtkObj(pNew,iVar10);
          Wlc_ObjAddFanins(pNew,pWVar6,p_01);
          Vec_IntWriteEntry(vFanins,iVar3,iVar10);
        }
        iVar2 = Wlc_ObjAlloc(pNew,0x17,0,iVar12 + -1,0);
        pWVar6 = Wlc_NtkObj(pNew,iVar2);
        Wlc_ObjAddFanins(pNew,pWVar6,vFanins);
        Vec_IntWriteEntry(p_00,iObj,iVar2);
        Vec_IntFree(p_01);
        goto LAB_002ffc10;
      }
      __assertion = "Wlc_ObjRange(pObj) == Wlc_ObjRange(pMem)";
      __line = 0x43;
    }
    else {
      __assertion = "nRegs * DataW == Wlc_ObjRange(pMem)";
      __line = 0x42;
    }
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcMem.c"
                ,__line,"void Wlc_NtkMemBlast_rec(Wlc_Ntk_t *, Wlc_Ntk_t *, int, Vec_Int_t *)");
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Memory blasting.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Wlc_NtkMemBlast_rec( Wlc_Ntk_t * pNew, Wlc_Ntk_t * p, int iObj, Vec_Int_t * vFanins )
{
    Wlc_Obj_t * pObj;
    int i, iFanin;
    if ( Wlc_ObjCopy(p, iObj) )
        return;
    pObj = Wlc_NtkObj( p, iObj );
    Wlc_ObjForEachFanin( pObj, iFanin, i )
        Wlc_NtkMemBlast_rec( pNew, p, iFanin, vFanins );
    if ( pObj->Type == WLC_OBJ_WRITE )
    {
        Vec_Int_t * vTemp = Vec_IntAlloc( 1 );
        Vec_Int_t * vBits = Vec_IntAlloc( 100 );
        Wlc_Obj_t * pMem  = Wlc_ObjFanin0(p, pObj);
        Wlc_Obj_t * pAddr = Wlc_ObjFanin1(p, pObj);
        Wlc_Obj_t * pData = Wlc_ObjFanin2(p, pObj);
        int DataW = Wlc_ObjRange(pData);
        int AddrW = Wlc_ObjRange(pAddr);
        int nRegs = 1 << AddrW, iObjNew, iObjDec;
        assert( nRegs * DataW == Wlc_ObjRange(pMem) );
        assert( Wlc_ObjRange(pObj) == Wlc_ObjRange(pMem) );
        // create decoder
        iObjDec = Wlc_ObjAlloc( pNew, WLC_OBJ_DEC, 0, nRegs-1, 0 );
        Vec_IntFill( vTemp, 1, Wlc_ObjCopy(p, Wlc_ObjId(p, pAddr)) );
        Wlc_ObjAddFanins( pNew, Wlc_NtkObj(pNew, iObjDec), vTemp );
        // create decoder bits
        for ( i = 0; i < nRegs; i++ )
        {
            int iObj2 = Wlc_ObjAlloc( pNew, WLC_OBJ_BIT_SELECT, 0, i, i );
            Vec_IntFill( vTemp, 1, iObjDec );
            Vec_IntPushTwo( vTemp, i, i );
            Wlc_ObjAddFanins( pNew, Wlc_NtkObj(pNew, iObj2), vTemp );
            Vec_IntPush( vBits, iObj2 );
        }
        // create data words
        Vec_IntClear( vFanins );
        for ( i = 0; i < nRegs; i++ )
        {
            int iObj2 = Wlc_ObjAlloc( pNew, WLC_OBJ_BIT_SELECT, 0, i*DataW+DataW-1, i*DataW );
            Vec_IntFill( vTemp, 1, Wlc_ObjCopy(p, Wlc_ObjId(p, pMem)) );
            Vec_IntPushTwo( vTemp, i*DataW+DataW-1, i*DataW );
            Wlc_ObjAddFanins( pNew, Wlc_NtkObj(pNew, iObj2), vTemp );
            Vec_IntPush( vFanins, iObj2 );
        }
        // create MUXes of data words controlled by decoder bits
        for ( i = 0; i < nRegs; i++ )
        {
            int iObj2 = Wlc_ObjAlloc( pNew, WLC_OBJ_MUX, 0, DataW-1, 0 );
            Vec_IntFill( vTemp, 1, Vec_IntEntry(vBits, i) );
            Vec_IntPushTwo( vTemp, Wlc_ObjCopy(p, Wlc_ObjId(p, pData)), Vec_IntEntry(vFanins, i) );
            Wlc_ObjAddFanins( pNew, Wlc_NtkObj(pNew, iObj2), vTemp );
            Vec_IntWriteEntry( vFanins, i, iObj2 );
        }
        // concatenate the results
        iObjNew = Wlc_ObjAlloc( pNew, WLC_OBJ_BIT_CONCAT, 0, nRegs*DataW-1, 0 );
        Wlc_ObjAddFanins( pNew, Wlc_NtkObj(pNew, iObjNew), vFanins );
        Wlc_ObjSetCopy( p, iObj, iObjNew );
        Vec_IntFree( vTemp );
        Vec_IntFree( vBits );
    }
    else if ( pObj->Type == WLC_OBJ_READ )
    {
        Vec_Int_t * vTemp = Vec_IntAlloc( 1 );
        Wlc_Obj_t * pMem  = Wlc_ObjFanin0(p, pObj);
        Wlc_Obj_t * pAddr = Wlc_ObjFanin1(p, pObj);
        int DataW = Wlc_ObjRange(pObj);
        int AddrW = Wlc_ObjRange(pAddr);
        int nRegs = 1 << AddrW, iObjNew;
        assert( nRegs * DataW == Wlc_ObjRange(pMem) );
        Vec_IntClear( vFanins );
        Vec_IntPush( vFanins, Wlc_ObjCopy(p, Wlc_ObjId(p, pAddr)) );
        for ( i = 0; i < nRegs; i++ )
        {
            int iObj2 = Wlc_ObjAlloc( pNew, WLC_OBJ_BIT_SELECT, 0, i*DataW+DataW-1, i*DataW );
            Vec_IntFill( vTemp, 1, Wlc_ObjCopy(p, Wlc_ObjId(p, pMem)) );
            Vec_IntPushTwo( vTemp, i*DataW+DataW-1, i*DataW );
            Wlc_ObjAddFanins( pNew, Wlc_NtkObj(pNew, iObj2), vTemp );
            Vec_IntPush( vFanins, iObj2 );
        }
        iObjNew = Wlc_ObjAlloc( pNew, WLC_OBJ_MUX, 0, DataW-1, 0 );
        Wlc_ObjAddFanins( pNew, Wlc_NtkObj(pNew, iObjNew), vFanins );
        Wlc_ObjSetCopy( p, iObj, iObjNew );
        Vec_IntFree( vTemp );
    }
    else
        Wlc_ObjDup( pNew, p, iObj, vFanins );
}